

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O1

ChannelPtr __thiscall cali::ConfigManager::get_channel(ConfigManager *this,char *name)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined8 *puVar4;
  bool bVar5;
  ChannelPtr CVar6;
  string local_50;
  
  puVar4 = (undefined8 *)**(long **)name;
  puVar1 = (undefined8 *)(*(long **)name)[1];
  bVar5 = puVar4 == puVar1;
  if (!bVar5) {
    do {
      ChannelController::name_abi_cxx11_(&local_50,(ChannelController *)*puVar4);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      in_RDX._M_pi = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX._M_pi = extraout_RDX_00;
      }
      if (iVar3 == 0) {
        (this->mP).
        super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)*puVar4;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[1];
        (this->mP).
        super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        if (!bVar5) goto LAB_001e8cce;
        break;
      }
      puVar4 = puVar4 + 2;
      bVar5 = puVar4 == puVar1;
    } while (!bVar5);
  }
  (this->mP).super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->mP).super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001e8cce:
  CVar6.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar6.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ChannelPtr)CVar6.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ConfigManager::ChannelPtr ConfigManager::get_channel(const char* name) const
{
    for (ChannelPtr& chn : mP->m_channels)
        if (chn->name() == name)
            return chn;

    return ChannelPtr();
}